

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  pointer *ppuVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  PrimitiveMode PVar7;
  undefined4 uVar8;
  iterator iVar9;
  pointer pPVar10;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar11;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar12;
  BufferView *pBVar13;
  vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *pvVar14;
  long lVar15;
  aiScene *paVar16;
  byte bVar17;
  glTF2Importer *pgVar18;
  iterator iVar19;
  uint uVar20;
  uint uVar21;
  pointer ppMVar22;
  aiMesh *paVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  aiVector3D *paVar25;
  long lVar26;
  pointer pRVar27;
  float *pfVar28;
  Logger *pLVar29;
  long *plVar30;
  aiAnimMesh **ppaVar31;
  aiAnimMesh *paVar32;
  Accessor *pAVar33;
  ulong *puVar34;
  aiFace *paVar35;
  uint **ppuVar36;
  uint *puVar37;
  int *piVar38;
  undefined8 *puVar39;
  undefined4 *puVar40;
  aiMesh **ppaVar41;
  ulong uVar42;
  _func_int **pp_Var43;
  ulong uVar44;
  int iVar45;
  aiMesh **ppaVar46;
  aiMesh **ppaVar47;
  size_t *psVar48;
  uint uVar49;
  uint uVar50;
  char *pcVar51;
  ulong uVar52;
  aiFace *paVar53;
  ulong *puVar54;
  bool bVar55;
  bool bVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  aiMesh *aim;
  Tangent *tangents;
  uint k;
  aiVector3D *tangentDiff;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  pointer local_f8;
  aiMesh *local_f0;
  ulong local_e8;
  Indexer local_e0;
  ulong local_c0;
  aiFace *local_b8;
  uint local_ac;
  Mesh *local_a8;
  glTF2Importer *local_a0;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  aiMesh **local_68;
  iterator iStack_60;
  aiMesh **local_58;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  Asset *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_68 = (aiMesh **)0x0;
  iStack_60._M_current = (aiMesh **)0x0;
  local_58 = (aiMesh **)0x0;
  local_ac = 0;
  ppMVar22 = (r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_a0 = this;
  local_40 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar22 & 0x7fffffff8U) != 0) {
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar44 = 0;
    do {
      local_a8 = ppMVar22[uVar44];
      iVar9._M_current =
           (local_a0->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (local_a0->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_48,iVar9,&local_ac);
      }
      else {
        *iVar9._M_current = local_ac;
        ppuVar1 = &(local_a0->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      local_f8 = (local_a8->primitives).
                 super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pPVar10 = *(pointer *)
                 ((long)&(local_a8->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                         ._M_impl + 8);
      local_ac = (int)((ulong)((long)pPVar10 - (long)local_f8) >> 8) + local_ac;
      if (pPVar10 != local_f8) {
        local_90 = &(local_a8->super_Object).name;
        local_38 = &(local_a8->super_Object).id;
        local_98 = 0;
        local_e8 = uVar44;
        do {
          uVar44 = local_98;
          paVar23 = (aiMesh *)operator_new(0x520);
          paVar23->mPrimitiveTypes = 0;
          paVar23->mNumVertices = 0;
          paVar23->mNumFaces = 0;
          memset(&paVar23->mVertices,0,0xcc);
          paVar23->mBones = (aiBone **)0x0;
          paVar23->mMaterialIndex = 0;
          (paVar23->mName).length = 0;
          (paVar23->mName).data[0] = '\0';
          memset((paVar23->mName).data + 1,0x1b,0x3ff);
          paVar23->mNumAnimMeshes = 0;
          paVar23->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar23->mMethod = 0;
          (paVar23->mAABB).mMin.x = 0.0;
          (paVar23->mAABB).mMin.y = 0.0;
          (paVar23->mAABB).mMin.z = 0.0;
          (paVar23->mAABB).mMax.x = 0.0;
          (paVar23->mAABB).mMax.y = 0.0;
          (paVar23->mAABB).mMax.z = 0.0;
          memset(paVar23->mColors,0,0xa0);
          local_f0 = paVar23;
          if (iStack_60._M_current == local_58) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_68,iStack_60,&local_f0);
          }
          else {
            *iStack_60._M_current = paVar23;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          paVar23 = local_f0;
          pbVar24 = local_90;
          if ((local_a8->super_Object).name._M_string_length == 0) {
            pbVar24 = local_38;
          }
          uVar42 = pbVar24->_M_string_length;
          if (uVar42 < 0x400) {
            (local_f0->mName).length = (ai_uint32)uVar42;
            memcpy((local_f0->mName).data,(pbVar24->_M_dataplus)._M_p,uVar42);
            (paVar23->mName).data[uVar42] = '\0';
          }
          if (0x100 < (ulong)((long)*(pointer *)
                                     ((long)&(local_a8->primitives).
                                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                             ._M_impl + 8) -
                             *(long *)&(local_a8->primitives).
                                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                       ._M_impl.super__Vector_impl_data)) {
            uVar20 = (local_f0->mName).length;
            (local_f0->mName).data[uVar20] = '-';
            pcVar51 = (local_f0->mName).data + (ulong)uVar20 + 1;
            uVar49 = 0x3ff - uVar20;
            uVar50 = 1;
            if ((int)local_98 < 0) {
              uVar42 = local_98 & 0xffffffff;
              if (1 < uVar49) {
                (local_f0->mName).data[(ulong)uVar20 + 1] = '-';
                pcVar51 = (local_f0->mName).data + (ulong)uVar20 + 2;
                uVar42 = (ulong)(uint)-(int)local_98;
                uVar50 = 2;
              }
            }
            else {
              uVar42 = local_98 & 0xffffffff;
            }
            if (uVar50 < uVar49) {
              iVar45 = 1000000000;
              bVar17 = 0;
              do {
                lVar26 = (long)(int)uVar42 / (long)iVar45;
                bVar55 = (int)lVar26 != 0;
                bVar56 = iVar45 == 1;
                if ((bool)(bVar17 | bVar56 | bVar55)) {
                  *pcVar51 = (char)lVar26 + '0';
                  pcVar51 = pcVar51 + 1;
                  uVar50 = uVar50 + 1;
                  uVar42 = (long)(int)uVar42 % (long)iVar45 & 0xffffffff;
                  if (iVar45 == 1) break;
                }
                iVar45 = iVar45 / 10;
                bVar17 = bVar17 | bVar56 | bVar55;
              } while (uVar50 < uVar49);
            }
            *pcVar51 = '\0';
            (local_f0->mName).length = (local_f0->mName).length + uVar50;
          }
          psVar48 = &local_e0.elemSize;
          local_f8 = local_f8 + uVar44;
          if ((ulong)local_f8->mode < 7) {
            local_f0->mPrimitiveTypes =
                 local_f0->mPrimitiveTypes | *(uint *)(&DAT_00748740 + (ulong)local_f8->mode * 4);
          }
          pRVar27 = *(pointer *)
                     &(local_f8->attributes).position.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(local_f8->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            local_f0->mNumVertices =
                 *(uint *)(*(long *)(*(long *)&(pRVar27->vector->
                                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar27->index * 8) + 0x70);
            puVar39 = *(undefined8 **)
                       &(local_f8->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar39 + (ulong)*(uint *)(puVar39 + 1) * 8),
                       &local_f0->mVertices);
          }
          pRVar27 = (local_f8->attributes).normal.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(local_f8->attributes).normal.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar27->vector->
                                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar27->index * 8),&local_f0->mNormals);
            pRVar27 = (local_f8->attributes).tangent.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(pointer *)
                  ((long)&(local_f8->attributes).tangent.
                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  + 8) != pRVar27) &&
               (pRVar27->vector !=
                (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
              local_e0.accessor = (Accessor *)0x0;
              glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                        (*(Accessor **)
                          (*(long *)&(pRVar27->vector->
                                     super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar27->index * 8),(Tangent **)&local_e0);
              paVar23 = local_f0;
              uVar20 = local_f0->mNumVertices;
              uVar44 = (ulong)uVar20 * 0xc;
              paVar25 = (aiVector3D *)operator_new__(uVar44);
              if (uVar20 != 0) {
                memset(paVar25,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar23->mTangents = paVar25;
              uVar20 = paVar23->mNumVertices;
              uVar44 = (ulong)uVar20 * 0xc;
              paVar25 = (aiVector3D *)operator_new__(uVar44);
              if (uVar20 != 0) {
                memset(paVar25,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar23->mBitangents = paVar25;
              if (paVar23->mNumVertices == 0) {
                if (local_e0.accessor == (Accessor *)0x0) goto LAB_0065b7ee;
              }
              else {
                lVar26 = 0;
                uVar44 = 0;
                pAVar33 = local_e0.accessor;
                do {
                  paVar25 = paVar23->mTangents;
                  *(int *)((long)&paVar25->z + lVar26) =
                       (int)*(size_t *)&(pAVar33->super_Object).index;
                  *(_func_int ***)((long)&paVar25->x + lVar26) =
                       (pAVar33->super_Object)._vptr_Object;
                  fVar2 = *(float *)&(pAVar33->super_Object)._vptr_Object;
                  paVar25 = paVar23->mBitangents;
                  fVar3 = *(float *)((long)&paVar23->mNormals->x + lVar26);
                  fVar4 = (float)(pAVar33->super_Object).oIndex;
                  uVar5 = *(undefined8 *)((long)&paVar23->mNormals->y + lVar26);
                  uVar6 = *(undefined8 *)((long)&(pAVar33->super_Object)._vptr_Object + 4);
                  fVar57 = (float)uVar5;
                  fVar58 = (float)((ulong)uVar5 >> 0x20);
                  fVar59 = (float)uVar6;
                  fVar60 = (float)((ulong)uVar6 >> 0x20);
                  *(ulong *)((long)&paVar25->x + lVar26) =
                       CONCAT44(fVar4 * (fVar2 * fVar58 - fVar3 * fVar60),
                                fVar4 * (fVar60 * fVar57 - fVar58 * fVar59));
                  *(float *)((long)&paVar25->z + lVar26) = (fVar3 * fVar59 - fVar2 * fVar57) * fVar4
                  ;
                  uVar44 = uVar44 + 1;
                  pAVar33 = (Accessor *)&(pAVar33->super_Object).id;
                  lVar26 = lVar26 + 0xc;
                  paVar23 = local_f0;
                } while (uVar44 < local_f0->mNumVertices);
              }
              operator_delete__(local_e0.accessor);
            }
          }
LAB_0065b7ee:
          pRVar27 = (local_f8->attributes).color.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f8->attributes).color.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar27) {
            lVar26 = 0x30;
            uVar44 = 0;
            do {
              pAVar33 = *(Accessor **)
                         (**(long **)((long)&pRVar27[-6].vector + lVar26 * 2) +
                         (ulong)*(uint *)((long)pRVar27 + lVar26 * 2 + -0x58) * 8);
              if (pAVar33->count == (ulong)local_f0->mNumVertices) {
                glTF2::Accessor::ExtractData<aiColor4t<float>>
                          (pAVar33,(aiColor4t<float> **)((long)local_f0->mColors + lVar26 + -0x30));
              }
              else {
                pLVar29 = DefaultLogger::get();
                std::operator+(&local_88,"Color stream size in mesh \"",local_90);
                plVar30 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar33 = (Accessor *)(plVar30 + 2);
                if ((Accessor *)*plVar30 == pAVar33) {
                  local_e0.elemSize = (size_t)(pAVar33->super_Object)._vptr_Object;
                  local_e0.stride = plVar30[3];
                  local_e0.accessor = (Accessor *)psVar48;
                }
                else {
                  local_e0.elemSize = (size_t)(pAVar33->super_Object)._vptr_Object;
                  local_e0.accessor = (Accessor *)*plVar30;
                }
                local_e0.data = (uint8_t *)plVar30[1];
                *plVar30 = (long)pAVar33;
                plVar30[1] = 0;
                *(undefined1 *)(plVar30 + 2) = 0;
                Logger::warn(pLVar29,(char *)local_e0.accessor);
                if (local_e0.accessor != (Accessor *)psVar48) {
                  operator_delete(local_e0.accessor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p);
                }
              }
              if (6 < uVar44) break;
              uVar44 = uVar44 + 1;
              pRVar27 = (local_f8->attributes).color.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar26 = lVar26 + 8;
            } while (uVar44 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f8->attributes).color.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar27 >> 4));
          }
          pRVar27 = (local_f8->attributes).texcoord.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f8->attributes).texcoord.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar27) {
            uVar44 = 0;
            do {
              pAVar33 = *(Accessor **)
                         (*(long *)&((pRVar27[uVar44].vector)->
                                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                    )._M_impl + (ulong)pRVar27[uVar44].index * 8);
              if (pAVar33->count == (ulong)local_f0->mNumVertices) {
                glTF2::Accessor::ExtractData<aiVector3t<float>>
                          (pAVar33,local_f0->mTextureCoords + uVar44);
                lVar26 = *(long *)&(local_f8->attributes).texcoord.
                                   super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                   ._M_impl.super__Vector_impl_data;
                local_f0->mNumUVComponents[uVar44] =
                     *(uint *)(&DAT_00942b48 +
                              (ulong)*(uint *)(*(long *)(**(long **)(lVar26 + uVar44 * 0x10) +
                                                        (ulong)*(uint *)(lVar26 + 8 + uVar44 * 0x10)
                                                        * 8) + 0x78) * 0x10);
                if (local_f0->mNumVertices != 0) {
                  pfVar28 = &local_f0->mTextureCoords[uVar44]->y;
                  uVar42 = 0;
                  do {
                    *pfVar28 = 1.0 - *pfVar28;
                    uVar42 = uVar42 + 1;
                    pfVar28 = pfVar28 + 3;
                  } while (uVar42 < local_f0->mNumVertices);
                }
              }
              else {
                pLVar29 = DefaultLogger::get();
                std::operator+(&local_88,"Texcoord stream size in mesh \"",local_90);
                plVar30 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar33 = (Accessor *)(plVar30 + 2);
                if ((Accessor *)*plVar30 == pAVar33) {
                  local_e0.elemSize = (size_t)(pAVar33->super_Object)._vptr_Object;
                  local_e0.stride = plVar30[3];
                  local_e0.accessor = (Accessor *)psVar48;
                }
                else {
                  local_e0.elemSize = (size_t)(pAVar33->super_Object)._vptr_Object;
                  local_e0.accessor = (Accessor *)*plVar30;
                }
                local_e0.data = (uint8_t *)plVar30[1];
                *plVar30 = (long)pAVar33;
                plVar30[1] = 0;
                *(undefined1 *)(plVar30 + 2) = 0;
                Logger::warn(pLVar29,(char *)local_e0.accessor);
                if (local_e0.accessor != (Accessor *)psVar48) {
                  operator_delete(local_e0.accessor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p);
                }
              }
              if (6 < uVar44) break;
              uVar44 = uVar44 + 1;
              pRVar27 = (local_f8->attributes).texcoord.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar44 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f8->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar27 >> 4));
          }
          uVar44 = local_e8;
          paVar23 = local_f0;
          lVar26 = (long)*(pointer *)
                          ((long)&(local_f8->targets).
                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                  ._M_impl + 8) -
                   *(long *)&(local_f8->targets).
                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                             ._M_impl.super__Vector_impl_data;
          if (lVar26 != 0) {
            lVar26 = lVar26 >> 3;
            local_f0->mNumAnimMeshes = (int)lVar26 * 0x38e38e39;
            ppaVar31 = (aiAnimMesh **)operator_new__(lVar26 * 0x71c71c71c71c71c8 & 0x7fffffff8);
            paVar23->mAnimMeshes = ppaVar31;
            if (*(pointer *)
                 ((long)&(local_f8->targets).
                         super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         ._M_impl + 8) !=
                (local_f8->targets).
                super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar42 = 0;
              do {
                paVar32 = aiCreateAnimMesh(local_f0);
                local_f0->mAnimMeshes[uVar42] = paVar32;
                paVar32 = local_f0->mAnimMeshes[uVar42];
                plVar30 = (long *)(*(long *)&(local_f8->targets).
                                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                             ._M_impl.super__Vector_impl_data + uVar42 * 0x48);
                if (plVar30[1] != *plVar30) {
                  local_e0.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)*plVar30 +
                              (ulong)*(uint *)((undefined8 *)*plVar30 + 1) * 8),
                             (aiVector3t<float> **)&local_e0);
                  if (local_f0->mNumVertices != 0) {
                    lVar26 = 8;
                    uVar44 = 0;
                    do {
                      paVar25 = paVar32->mVertices;
                      *(float *)((long)paVar25 + lVar26 + -8) =
                           *(float *)((long)local_e0.accessor + lVar26 + -8) +
                           *(float *)((long)paVar25 + lVar26 + -8);
                      *(float *)((long)paVar25 + lVar26 + -4) =
                           *(float *)((long)local_e0.accessor + lVar26 + -4) +
                           *(float *)((long)paVar25 + lVar26 + -4);
                      *(float *)((long)&paVar25->x + lVar26) =
                           *(float *)((long)&((local_e0.accessor)->super_Object)._vptr_Object +
                                     lVar26) + *(float *)((long)&paVar25->x + lVar26);
                      uVar44 = uVar44 + 1;
                      lVar26 = lVar26 + 0xc;
                    } while (uVar44 < local_f0->mNumVertices);
                  }
                  if (local_e0.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e0.accessor);
                  }
                }
                if (plVar30[4] != plVar30[3]) {
                  local_e0.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar30[3] +
                              (ulong)*(uint *)((undefined8 *)plVar30[3] + 1) * 8),
                             (aiVector3t<float> **)&local_e0);
                  if (local_f0->mNumVertices != 0) {
                    lVar26 = 8;
                    uVar44 = 0;
                    do {
                      paVar25 = paVar32->mNormals;
                      *(float *)((long)paVar25 + lVar26 + -8) =
                           *(float *)((long)local_e0.accessor + lVar26 + -8) +
                           *(float *)((long)paVar25 + lVar26 + -8);
                      *(float *)((long)paVar25 + lVar26 + -4) =
                           *(float *)((long)local_e0.accessor + lVar26 + -4) +
                           *(float *)((long)paVar25 + lVar26 + -4);
                      *(float *)((long)&paVar25->x + lVar26) =
                           *(float *)((long)&((local_e0.accessor)->super_Object)._vptr_Object +
                                     lVar26) + *(float *)((long)&paVar25->x + lVar26);
                      uVar44 = uVar44 + 1;
                      lVar26 = lVar26 + 0xc;
                    } while (uVar44 < local_f0->mNumVertices);
                  }
                  if (local_e0.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e0.accessor);
                  }
                }
                if (plVar30[7] != plVar30[6]) {
                  local_e0.accessor = (Accessor *)0x0;
                  puVar39 = *(undefined8 **)
                             &(local_f8->attributes).tangent.
                              super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                              ._M_impl.super__Vector_impl_data;
                  glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                            (*(Accessor **)(*(long *)*puVar39 + (ulong)*(uint *)(puVar39 + 1) * 8),
                             (Tangent **)&local_e0);
                  local_88._M_dataplus._M_p = (pointer)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar30[6] +
                              (ulong)*(uint *)((undefined8 *)plVar30[6] + 1) * 8),
                             (aiVector3t<float> **)&local_88);
                  if (local_f0->mNumVertices == 0) {
                    if (local_e0.accessor != (Accessor *)0x0) goto LAB_0065bde1;
                  }
                  else {
                    lVar26 = 0;
                    uVar44 = 0;
                    pAVar33 = local_e0.accessor;
                    do {
                      *(float *)&(pAVar33->super_Object)._vptr_Object =
                           *(float *)(local_88._M_dataplus._M_p + lVar26) +
                           *(float *)&(pAVar33->super_Object)._vptr_Object;
                      *(float *)((long)&(pAVar33->super_Object)._vptr_Object + 4) =
                           *(float *)(local_88._M_dataplus._M_p + 4 + lVar26) +
                           *(float *)((long)&(pAVar33->super_Object)._vptr_Object + 4);
                      (pAVar33->super_Object).index =
                           (int)(*(float *)(local_88._M_dataplus._M_p + 8 + lVar26) +
                                (float)(pAVar33->super_Object).index);
                      paVar25 = paVar32->mTangents;
                      *(int *)((long)&paVar25->z + lVar26) =
                           (int)*(size_t *)&(pAVar33->super_Object).index;
                      *(_func_int ***)((long)&paVar25->x + lVar26) =
                           (pAVar33->super_Object)._vptr_Object;
                      fVar2 = *(float *)&(pAVar33->super_Object)._vptr_Object;
                      paVar25 = paVar32->mBitangents;
                      fVar3 = *(float *)((long)&paVar32->mNormals->x + lVar26);
                      fVar4 = (float)(pAVar33->super_Object).oIndex;
                      uVar5 = *(undefined8 *)((long)&paVar32->mNormals->y + lVar26);
                      uVar6 = *(undefined8 *)((long)&(pAVar33->super_Object)._vptr_Object + 4);
                      fVar57 = (float)uVar5;
                      fVar58 = (float)((ulong)uVar5 >> 0x20);
                      fVar59 = (float)uVar6;
                      fVar60 = (float)((ulong)uVar6 >> 0x20);
                      *(ulong *)((long)&paVar25->x + lVar26) =
                           CONCAT44(fVar4 * (fVar2 * fVar58 - fVar3 * fVar60),
                                    fVar4 * (fVar60 * fVar57 - fVar58 * fVar59));
                      *(float *)((long)&paVar25->z + lVar26) =
                           (fVar3 * fVar59 - fVar2 * fVar57) * fVar4;
                      uVar44 = uVar44 + 1;
                      lVar26 = lVar26 + 0xc;
                      pAVar33 = (Accessor *)&(pAVar33->super_Object).id;
                    } while (uVar44 < local_f0->mNumVertices);
LAB_0065bde1:
                    operator_delete__(local_e0.accessor);
                  }
                  if (local_88._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete__(local_88._M_dataplus._M_p);
                  }
                }
                lVar26 = *(long *)&(local_a8->weights).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data;
                if (uVar42 < (ulong)((long)*(pointer *)
                                            ((long)&(local_a8->weights).
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl + 8) - lVar26 >> 2)) {
                  paVar32->mWeight = *(float *)(lVar26 + uVar42 * 4);
                }
                uVar42 = uVar42 + 1;
                uVar44 = local_e8;
              } while (uVar42 < (ulong)(((long)*(pointer *)
                                                ((long)&(local_f8->targets).
                                                                                                                
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(local_f8->targets).
                                                                                                      
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl.super__Vector_impl_data >> 3) *
                                       -0x71c71c71c71c71c7));
            }
          }
          paVar23 = local_f0;
          pvVar11 = (local_f8->indices).vector;
          if (pvVar11 == (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
            PVar7 = local_f8->mode;
            if (PrimitiveMode_TRIANGLE_FAN < PVar7) goto switchD_0065c0c4_default;
            uVar20 = local_f0->mNumVertices;
            uVar44 = (ulong)uVar20;
            switch(PVar7) {
            case PrimitiveMode_POINTS:
              puVar34 = (ulong *)operator_new__(uVar44 * 0x10 + 8);
              *puVar34 = uVar44;
              paVar53 = (aiFace *)(puVar34 + 1);
              if (uVar44 != 0) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar44);
                if (uVar44 != 0) {
                  uVar42 = 0;
                  do {
                    *(undefined4 *)(puVar34 + 1) = 1;
                    puVar40 = (undefined4 *)operator_new__(4);
                    puVar34[2] = (ulong)puVar40;
                    *puVar40 = (int)uVar42;
                    uVar42 = uVar42 + 1;
                    puVar34 = puVar34 + 2;
                  } while (uVar44 != uVar42);
                  goto LAB_0065cb6c;
                }
              }
              break;
            case PrimitiveMode_LINES:
              uVar42 = (ulong)(uVar20 >> 1);
              puVar34 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar34 = uVar42;
              paVar53 = (aiFace *)(puVar34 + 1);
              if (1 < uVar20) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar42);
              }
              if (uVar44 != 0) {
                uVar49 = 0;
                do {
                  paVar53[uVar49 >> 1].mNumIndices = 2;
                  puVar37 = (uint *)operator_new__(8);
                  paVar53[uVar49 >> 1].mIndices = puVar37;
                  *puVar37 = uVar49;
                  puVar37[1] = uVar49 + 1;
                  uVar49 = uVar49 + 2;
                } while (uVar49 < uVar20);
LAB_0065cb5a:
                uVar20 = (uint)uVar42;
                goto LAB_0065cb6c;
              }
              break;
            default:
              uVar42 = (ulong)(uVar20 - (PVar7 == PrimitiveMode_LINE_STRIP));
              local_c0 = uVar42;
              puVar34 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar34 = local_c0;
              paVar53 = (aiFace *)(puVar34 + 1);
              if ((int)local_c0 != 0) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar42);
              }
              paVar53->mNumIndices = 2;
              puVar39 = (undefined8 *)operator_new__(8);
              puVar34[2] = (ulong)puVar39;
              *puVar39 = 0x100000000;
              local_b8 = paVar53;
              if (2 < uVar20) {
                puVar54 = puVar34 + 4;
                uVar42 = 2;
                do {
                  uVar8 = *(undefined4 *)(puVar54[-2] + 4);
                  *(undefined4 *)(puVar54 + -1) = 2;
                  puVar40 = (undefined4 *)operator_new__(8);
                  *puVar54 = (ulong)puVar40;
                  *puVar40 = uVar8;
                  puVar40[1] = (int)uVar42;
                  uVar42 = uVar42 + 1;
                  puVar54 = puVar54 + 2;
                } while (uVar44 != uVar42);
              }
              paVar53 = local_b8;
              if (local_f8->mode == PrimitiveMode_LINE_LOOP) {
                uVar49 = local_b8[uVar20 - 2].mIndices[1];
                uVar50 = *(uint *)puVar34[2];
                local_b8[uVar20 - 1].mNumIndices = 2;
                puVar37 = (uint *)operator_new__(8);
                paVar53[uVar20 - 1].mIndices = puVar37;
                *puVar37 = uVar49;
                puVar37[1] = uVar50;
              }
              uVar20 = (uint)local_c0;
              goto LAB_0065cb6c;
            case PrimitiveMode_TRIANGLES:
              uVar42 = uVar44 / 3;
              puVar34 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar34 = uVar42;
              paVar53 = (aiFace *)(puVar34 + 1);
              if (2 < uVar20) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar42);
              }
              if (uVar44 != 0) {
                uVar44 = 0;
                do {
                  iVar45 = (int)uVar44;
                  uVar44 = uVar44 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  *(undefined4 *)((long)&paVar53->mNumIndices + uVar44) = 3;
                  piVar38 = (int *)operator_new__(0xc);
                  *(int **)((long)&paVar53->mIndices + uVar44) = piVar38;
                  *piVar38 = iVar45;
                  piVar38[1] = iVar45 + 1;
                  piVar38[2] = iVar45 + 2;
                  uVar44 = (ulong)(iVar45 + 3U);
                } while (iVar45 + 3U < uVar20);
                goto LAB_0065cb5a;
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar20 = uVar20 - 2;
              uVar42 = (ulong)uVar20;
              puVar34 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar34 = uVar42;
              paVar53 = (aiFace *)(puVar34 + 1);
              if (uVar20 != 0) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar42);
                if (uVar20 != 0) {
                  uVar44 = 0;
                  do {
                    puVar54 = puVar34 + 2;
                    *(undefined4 *)(puVar34 + 1) = 3;
                    iVar45 = (int)uVar44;
                    if ((uVar44 & 1) == 0) {
                      piVar38 = (int *)operator_new__(0xc);
                      *puVar54 = (ulong)piVar38;
                      *piVar38 = iVar45;
                      piVar38[1] = iVar45 + 1;
                    }
                    else {
                      piVar38 = (int *)operator_new__(0xc);
                      *puVar54 = (ulong)piVar38;
                      *piVar38 = iVar45 + 1;
                      piVar38[1] = iVar45;
                    }
                    uVar44 = uVar44 + 1;
                    piVar38[2] = iVar45 + 2;
                    puVar34 = puVar54;
                  } while (uVar42 != uVar44);
                  goto LAB_0065cb5a;
                }
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar20 = uVar20 - 2;
              uVar42 = (ulong)uVar20;
              puVar34 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar34 = uVar42;
              paVar53 = (aiFace *)(puVar34 + 1);
              if (uVar20 != 0) {
                paVar35 = paVar53;
                do {
                  paVar35->mNumIndices = 0;
                  paVar35->mIndices = (uint *)0x0;
                  paVar35 = paVar35 + 1;
                } while (paVar35 != paVar53 + uVar42);
              }
              paVar53->mNumIndices = 3;
              puVar39 = (undefined8 *)operator_new__(0xc);
              puVar34[2] = (ulong)puVar39;
              *puVar39 = 0x100000000;
              *(undefined4 *)(puVar39 + 1) = 2;
              if (uVar20 < 2) goto LAB_0065cb5a;
              lVar26 = 0x10;
              iVar45 = 3;
              local_b8 = paVar53;
              do {
                uVar8 = *(undefined4 *)(*(long *)((long)puVar34 + lVar26) + 8);
                *(undefined4 *)((long)puVar34 + lVar26 + 8) = 3;
                puVar40 = (undefined4 *)operator_new__(0xc);
                *(undefined4 **)((long)puVar34 + lVar26 + 0x10) = puVar40;
                *puVar40 = 0;
                puVar40[1] = uVar8;
                puVar40[2] = iVar45;
                lVar26 = lVar26 + 0x10;
                iVar45 = iVar45 + 1;
                paVar53 = local_b8;
              } while (uVar42 * 0x10 != lVar26);
              goto LAB_0065cb6c;
            }
            paVar23->mFaces = paVar53;
            paVar23->mNumFaces = 0;
            uVar44 = local_e8;
            goto switchD_0065c0c4_default;
          }
          pAVar33 = *(Accessor **)
                     (*(long *)&(pvVar11->
                                super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                )._M_impl + (ulong)(local_f8->indices).index * 8);
          uVar42 = pAVar33->count;
          pvVar12 = (pAVar33->bufferView).vector;
          if (pvVar12 == (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) {
LAB_0065bef1:
            local_e0.data = (uint8_t *)0x0;
          }
          else {
            pBVar13 = (pvVar12->
                      super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[(pAVar33->bufferView).index];
            pvVar14 = (pBVar13->buffer).vector;
            if (pvVar14 == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0)
            goto LAB_0065bef1;
            lVar26 = *(long *)(*(long *)&pvVar14->
                                         super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>
                              + (ulong)(pBVar13->buffer).index * 8);
            lVar15 = *(long *)(lVar26 + 0x70);
            if (lVar15 == 0) goto LAB_0065bef1;
            uVar44 = pBVar13->byteOffset + pAVar33->byteOffset;
            puVar34 = *(ulong **)(lVar26 + 0x68);
            if (puVar34 == (ulong *)0x0) {
LAB_0065c047:
              local_e0.data = (uint8_t *)(lVar15 + uVar44);
            }
            else {
              uVar52 = *puVar34;
              if ((uVar44 < uVar52) || (uVar52 + puVar34[3] <= uVar44)) goto LAB_0065c047;
              local_e0.data = (uint8_t *)((uVar44 - uVar52) + puVar34[2]);
            }
          }
          iVar45 = *(int *)(&DAT_00942b48 + (ulong)pAVar33->type * 0x10);
          local_e0.accessor = pAVar33;
          uVar20 = glTF2::ComponentTypeSize(pAVar33->componentType);
          local_e0.elemSize = (size_t)(uVar20 * iVar45);
          pvVar12 = (pAVar33->bufferView).vector;
          local_e0.stride = local_e0.elemSize;
          if ((pvVar12 != (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0)
             && (pp_Var43 = (_func_int **)
                            (ulong)(pvVar12->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [(pAVar33->bufferView).index]->byteStride,
                pp_Var43 != (_func_int **)0x0)) {
            local_e0.stride = (size_t)pp_Var43;
          }
          if (local_e0.data == (uint8_t *)0x0) {
            __assert_fail("data.IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Importer.cpp"
                          ,0x207,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
          }
          uVar44 = local_e8;
          switch(local_f8->mode) {
          case PrimitiveMode_POINTS:
            uVar44 = uVar42 * 0x10 + 8;
            if (0xfffffffffffffff < uVar42) {
              uVar44 = 0xffffffffffffffff;
            }
            puVar34 = (ulong *)operator_new__(uVar44);
            *puVar34 = uVar42;
            paVar53 = (aiFace *)(puVar34 + 1);
            if (uVar42 != 0) {
              paVar35 = paVar53;
              do {
                paVar35->mNumIndices = 0;
                paVar35->mIndices = (uint *)0x0;
                paVar35 = paVar35 + 1;
              } while (paVar35 != paVar53 + uVar42);
              if (uVar42 == 0) {
                uVar20 = 0;
                paVar23 = local_f0;
              }
              else {
                uVar20 = 1;
                uVar44 = 0;
                do {
                  uVar49 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 - 1);
                  paVar53[uVar44].mNumIndices = 1;
                  puVar37 = (uint *)operator_new__(4);
                  paVar53[uVar44].mIndices = puVar37;
                  *puVar37 = uVar49;
                  uVar44 = (ulong)uVar20;
                  uVar20 = uVar20 + 1;
                } while (uVar44 < uVar42);
                uVar20 = (uint)uVar42;
                paVar23 = local_f0;
              }
              goto LAB_0065cb6c;
            }
            break;
          case PrimitiveMode_LINES:
            uVar44 = uVar42 >> 1;
            puVar34 = (ulong *)operator_new__(-(ulong)(uVar42 >> 0x3d != 0) | uVar44 * 0x10 | 8);
            *puVar34 = uVar44;
            paVar53 = (aiFace *)(puVar34 + 1);
            if (1 < uVar42) {
              paVar35 = paVar53;
              do {
                paVar35->mNumIndices = 0;
                paVar35->mIndices = (uint *)0x0;
                paVar35 = paVar35 + 1;
              } while (paVar35 != paVar53 + uVar44);
            }
            if (uVar42 != 0) {
              uVar20 = 2;
              local_c0 = uVar44;
              do {
                uVar21 = uVar20 - 2 >> 1;
                uVar49 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 - 2);
                uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 - 1);
                paVar53[uVar21].mNumIndices = 2;
                puVar37 = (uint *)operator_new__(8);
                paVar53[uVar21].mIndices = puVar37;
                *puVar37 = uVar49;
                puVar37[1] = uVar50;
                uVar44 = (ulong)uVar20;
                uVar20 = uVar20 + 2;
              } while (uVar44 < uVar42);
LAB_0065c79a:
              uVar20 = (uint)local_c0;
              paVar23 = local_f0;
              goto LAB_0065cb6c;
            }
            break;
          case PrimitiveMode_LINE_LOOP:
          case PrimitiveMode_LINE_STRIP:
            uVar52 = uVar42 - (local_f8->mode == PrimitiveMode_LINE_STRIP);
            uVar44 = uVar52 * 0x10 + 8;
            if (0xfffffffffffffff < uVar52) {
              uVar44 = 0xffffffffffffffff;
            }
            puVar34 = (ulong *)operator_new__(uVar44);
            *puVar34 = uVar52;
            paVar53 = (aiFace *)(puVar34 + 1);
            if (uVar52 != 0) {
              paVar35 = paVar53;
              do {
                paVar35->mNumIndices = 0;
                paVar35->mIndices = (uint *)0x0;
                paVar35 = paVar35 + 1;
              } while (paVar35 != paVar53 + uVar52);
            }
            uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,0);
            uVar49 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,1);
            paVar53->mNumIndices = 2;
            puVar37 = (uint *)operator_new__(8);
            puVar34[2] = (ulong)puVar37;
            *puVar37 = uVar20;
            puVar37[1] = uVar49;
            local_c0 = uVar52;
            if (2 < uVar42) {
              uVar20 = 3;
              do {
                uVar49 = *(uint *)(puVar34[(ulong)(uVar20 - 3) * 2 + 2] + 4);
                uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 - 1);
                paVar53[uVar20 - 2].mNumIndices = 2;
                puVar37 = (uint *)operator_new__(8);
                paVar53[uVar20 - 2].mIndices = puVar37;
                *puVar37 = uVar49;
                puVar37[1] = uVar50;
                uVar44 = (ulong)uVar20;
                uVar20 = uVar20 + 1;
              } while (uVar44 < uVar42);
            }
            if (local_f8->mode != PrimitiveMode_LINE_LOOP) goto LAB_0065c79a;
            uVar20 = *(uint *)(puVar34[uVar42 * 2 + -2] + 4);
            uVar49 = *(uint *)puVar34[2];
            *(undefined4 *)(puVar34 + uVar42 * 2 + -1) = 2;
            puVar37 = (uint *)operator_new__(8);
            paVar53[uVar42 - 1].mIndices = puVar37;
            *puVar37 = uVar20;
            puVar37[1] = uVar49;
            uVar42 = local_c0;
            goto LAB_0065c7a4;
          case PrimitiveMode_TRIANGLES:
            uVar52 = uVar42 / 3;
            uVar44 = uVar52 * 0x10 + 8;
            if (2 < (uint)(uVar42 >> 0x3c)) {
              uVar44 = 0xffffffffffffffff;
            }
            puVar34 = (ulong *)operator_new__(uVar44);
            *puVar34 = uVar52;
            paVar53 = (aiFace *)(puVar34 + 1);
            if (2 < uVar42) {
              paVar35 = paVar53;
              do {
                paVar35->mNumIndices = 0;
                paVar35->mIndices = (uint *)0x0;
                paVar35 = paVar35 + 1;
              } while (paVar35 != paVar53 + uVar52);
            }
            if (uVar42 != 0) {
              uVar20 = 0;
              local_c0 = uVar52;
              local_b8 = paVar53;
              do {
                uVar44 = (ulong)uVar20 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                uVar49 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20);
                uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 + 1);
                uVar21 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20 + 2);
                *(undefined4 *)((long)&local_b8->mNumIndices + uVar44) = 3;
                puVar37 = (uint *)operator_new__(0xc);
                *(uint **)((long)&local_b8->mIndices + uVar44) = puVar37;
                *puVar37 = uVar49;
                puVar37[1] = uVar50;
                puVar37[2] = uVar21;
                uVar49 = uVar20 + 3;
                uVar20 = uVar20 + 3;
                paVar53 = local_b8;
              } while (uVar49 < uVar42);
              goto LAB_0065c79a;
            }
            break;
          case PrimitiveMode_TRIANGLE_STRIP:
            uVar42 = uVar42 - 2;
            uVar44 = uVar42 * 0x10 + 8;
            if (0xfffffffffffffff < uVar42) {
              uVar44 = 0xffffffffffffffff;
            }
            puVar34 = (ulong *)operator_new__(uVar44);
            *puVar34 = uVar42;
            paVar53 = (aiFace *)(puVar34 + 1);
            if (uVar42 != 0) {
              paVar35 = paVar53;
              do {
                paVar35->mNumIndices = 0;
                paVar35->mIndices = (uint *)0x0;
                paVar35 = paVar35 + 1;
              } while (paVar35 != paVar53 + uVar42);
              if (uVar42 == 0) {
                uVar20 = 0;
                paVar23 = local_f0;
              }
              else {
                uVar44 = 0;
                uVar20 = 1;
                local_b8 = paVar53;
                do {
                  uVar50 = uVar20 - 1;
                  paVar53 = local_b8 + uVar44;
                  uVar49 = uVar20 + 1;
                  if ((uVar50 & 1) == 0) {
                    uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar50);
                    local_c0 = CONCAT44(local_c0._4_4_,uVar50);
                    uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20);
                    uVar21 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar49);
                    paVar53->mNumIndices = 3;
                    puVar37 = (uint *)operator_new__(0xc);
                  }
                  else {
                    uVar21 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar20);
                    local_c0 = CONCAT44(local_c0._4_4_,uVar21);
                    uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar50);
                    uVar21 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,uVar49);
                    paVar53->mNumIndices = 3;
                    puVar37 = (uint *)operator_new__(0xc);
                  }
                  paVar53->mIndices = puVar37;
                  *puVar37 = (uint)local_c0;
                  puVar37[1] = uVar50;
                  puVar37[2] = uVar21;
                  uVar44 = (ulong)uVar20;
                  uVar20 = uVar49;
                } while (uVar44 < uVar42);
                uVar20 = (uint)uVar42;
                paVar23 = local_f0;
                paVar53 = local_b8;
              }
              goto LAB_0065cb6c;
            }
            break;
          case PrimitiveMode_TRIANGLE_FAN:
            uVar42 = uVar42 - 2;
            uVar44 = uVar42 * 0x10 + 8;
            if (0xfffffffffffffff < uVar42) {
              uVar44 = 0xffffffffffffffff;
            }
            paVar35 = (aiFace *)operator_new__(uVar44);
            *(ulong *)paVar35 = uVar42;
            paVar53 = (aiFace *)&paVar35->mIndices;
            if (uVar42 != 0) {
              ppuVar36 = (uint **)paVar53;
              do {
                *(undefined4 *)ppuVar36 = 0;
                ppuVar36[1] = (uint *)0x0;
                ppuVar36 = ppuVar36 + 2;
              } while (ppuVar36 != (uint **)((long)paVar53 + uVar42 * 2 * 8));
            }
            uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,0);
            uVar49 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,1);
            uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,2);
            *(undefined4 *)paVar53 = 3;
            puVar37 = (uint *)operator_new__(0xc);
            *(uint **)(paVar35 + 1) = puVar37;
            *puVar37 = uVar20;
            puVar37[1] = uVar49;
            puVar37[2] = uVar50;
            if (1 < uVar42) {
              uVar44 = 1;
              iVar45 = 3;
              local_b8 = paVar35;
              do {
                uVar20 = **(uint **)(local_b8 + 1);
                uVar49 = *(uint *)(*(ulong *)(paVar35 + (ulong)(iVar45 - 3) + 1) + 8);
                uVar50 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e0,iVar45);
                *(undefined4 *)((long)paVar53 + uVar44 * 2 * 8) = 3;
                puVar37 = (uint *)operator_new__(0xc);
                *(uint **)((long)paVar53 + (uVar44 * 2 + 1) * 8) = puVar37;
                *puVar37 = uVar20;
                puVar37[1] = uVar49;
                puVar37[2] = uVar50;
                uVar44 = (ulong)(iVar45 - 1);
                iVar45 = iVar45 + 1;
              } while (uVar44 < uVar42);
            }
            goto LAB_0065c7a4;
          default:
            goto switchD_0065c0c4_default;
          }
          uVar42 = 0;
LAB_0065c7a4:
          uVar20 = (uint)uVar42;
          paVar23 = local_f0;
LAB_0065cb6c:
          paVar23->mFaces = paVar53;
          paVar23->mNumFaces = uVar20;
          uVar44 = local_e8;
          if (uVar20 != 0) {
            uVar42 = 0;
            bVar55 = false;
            do {
              if ((ulong)paVar53[uVar42].mNumIndices != 0) {
                uVar52 = 0;
                do {
                  if (paVar23->mNumVertices <= paVar53[uVar42].mIndices[uVar52]) {
                    if (!bVar55) {
                      __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Importer.cpp"
                                    ,0x29c,
                                    "void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
                    }
                    goto switchD_0065c0c4_default;
                  }
                  uVar52 = uVar52 + 1;
                } while (paVar53[uVar42].mNumIndices != uVar52);
              }
              uVar42 = uVar42 + 1;
              bVar55 = uVar20 <= uVar42;
            } while (uVar42 != uVar20);
          }
switchD_0065c0c4_default:
          if ((local_f8->material).vector ==
              (vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> *)0x0) {
            uVar20 = local_a0->mScene->mNumMaterials - 1;
          }
          else {
            uVar20 = (local_f8->material).index;
          }
          local_f0->mMaterialIndex = uVar20;
          local_98 = (ulong)((int)local_98 + 1);
          local_f8 = (local_a8->primitives).
                     super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (local_98 <
                 (ulong)((long)*(pointer *)
                                ((long)&(local_a8->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl + 8) - (long)local_f8 >> 8));
      }
      uVar44 = uVar44 + 1;
      ppMVar22 = (local_40->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar44 < ((ulong)((long)(local_40->meshes).mObjs.
                                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar22) >>
                       3 & 0xffffffff));
  }
  pgVar18 = local_a0;
  iVar9._M_current =
       (local_a0->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar9._M_current ==
      (local_a0->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a0->meshOffsets,iVar9,
               &local_ac);
  }
  else {
    *iVar9._M_current = local_ac;
    ppuVar1 = &(local_a0->meshOffsets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar19._M_current = iStack_60._M_current;
  ppaVar46 = local_68;
  paVar16 = pgVar18->mScene;
  uVar20 = (uint)((ulong)((long)iStack_60._M_current - (long)local_68) >> 3);
  paVar16->mNumMeshes = uVar20;
  ppaVar47 = local_68;
  if (uVar20 != 0) {
    ppaVar41 = (aiMesh **)operator_new__((long)iStack_60._M_current - (long)local_68 & 0x7fffffff8);
    paVar16->mMeshes = ppaVar41;
    ppaVar47 = ppaVar46;
    for (; ppaVar46 != iVar19._M_current; ppaVar46 = ppaVar46 + 1) {
      paVar23 = *ppaVar46;
      *ppaVar46 = *ppaVar41;
      *ppaVar41 = paVar23;
      ppaVar41 = ppaVar41 + 1;
      ppaVar47 = local_68;
    }
  }
  if (ppaVar47 != (aiMesh **)0x0) {
    operator_delete(ppaVar47);
  }
  return;
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

        meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;

            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

            if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
                attr.position[0]->ExtractData(aim->mVertices);
            }

            if (attr.normal.size() > 0 && attr.normal[0]) {
                attr.normal[0]->ExtractData(aim->mNormals);

                // only extract tangents if normals are present
                if (attr.tangent.size() > 0 && attr.tangent[0]) {
                    // generate bitangents from normals and tangents according to spec
                    Tangent *tangents = nullptr;

                    attr.tangent[0]->ExtractData(tangents);

                    aim->mTangents = new aiVector3D[aim->mNumVertices];
                    aim->mBitangents = new aiVector3D[aim->mNumVertices];

                    for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                        aim->mTangents[i] = tangents[i].xyz;
                        aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
                    }

                    delete [] tangents;
                }
            }

            for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
                if (attr.color[c]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
                        "\" does not match the vertex count");
                    continue;
                }
                attr.color[c]->ExtractData(aim->mColors[c]);
            }
            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                if (attr.texcoord[tc]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
                                               "\" does not match the vertex count");
                    continue;
                }

                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }

            std::vector<Mesh::Primitive::Target>& targets = prim.targets;
            if (targets.size() > 0) {
                aim->mNumAnimMeshes = (unsigned int)targets.size();
                aim->mAnimMeshes = new aiAnimMesh*[aim->mNumAnimMeshes];
                for (size_t i = 0; i < targets.size(); i++) {
                    aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
                    aiAnimMesh& aiAnimMesh = *(aim->mAnimMeshes[i]);
                    Mesh::Primitive::Target& target = targets[i];

                    if (target.position.size() > 0) {
                        aiVector3D *positionDiff = nullptr;
                        target.position[0]->ExtractData(positionDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
                        }
                        delete [] positionDiff;
                    }
                    if (target.normal.size() > 0) {
                        aiVector3D *normalDiff = nullptr;
                        target.normal[0]->ExtractData(normalDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
                        }
                        delete [] normalDiff;
                    }
                    if (target.tangent.size() > 0) {
                        Tangent *tangent = nullptr;
                        attr.tangent[0]->ExtractData(tangent);

                        aiVector3D *tangentDiff = nullptr;
                        target.tangent[0]->ExtractData(tangentDiff);

                        for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
                            tangent[vertexId].xyz += tangentDiff[vertexId];
                            aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
                            aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
                        }
                        delete [] tangent;
                        delete [] tangentDiff;
                    }
                    if (mesh.weights.size() > i) {
                        aiAnimMesh.mWeight = mesh.weights[i];
                    }
                }
            }


            aiFace* faces = 0;
            size_t nFaces = 0;

            if (prim.indices) {
                size_t count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < nFaces; ++i) {
                            //The ordering is to ensure that the triangles are all drawn with the same orientation
                            if ((i + 1) % 2 == 0)
                            {
                                //For even n, vertices n + 1, n, and n + 2 define triangle n
                                SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
                            }
                            else
                            {
                                //For odd n, vertices n, n+1, and n+2 define triangle n
                                SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                            }
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 1; i < nFaces; ++i) {
                            SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < nFaces; ++i) {
                        //The ordering is to ensure that the triangles are all drawn with the same orientation
                        if ((i+1) % 2 == 0)
                        {
                            //For even n, vertices n + 1, n, and n + 2 define triangle n
                            SetFace(faces[i], i+1, i, i+2);
                        }
                        else
                        {
                            //For odd n, vertices n, n+1, and n+2 define triangle n
                            SetFace(faces[i], i, i+1, i+2);
                        }
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 1; i < nFaces; ++i) {
                        SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = static_cast<unsigned int>(nFaces);
                ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
            else {
                aim->mMaterialIndex = mScene->mNumMaterials - 1;
            }

        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}